

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

bool icu_63::number::impl::AffixUtils::hasNext(AffixTag *tag,UnicodeString *string)

{
  int iVar1;
  char16_t cVar2;
  int32_t iVar3;
  UnicodeString *string_local;
  AffixTag *tag_local;
  
  if (tag->offset < 0) {
    tag_local._7_1_ = false;
  }
  else if (tag->offset == 0) {
    iVar3 = UnicodeString::length(string);
    tag_local._7_1_ = 0 < iVar3;
  }
  else {
    if (((tag->state == STATE_INSIDE_QUOTE) &&
        (iVar1 = tag->offset, iVar3 = UnicodeString::length(string), iVar1 == iVar3 + -1)) &&
       (cVar2 = UnicodeString::charAt(string,tag->offset), cVar2 == L'\'')) {
      return false;
    }
    if (tag->state == STATE_BASE) {
      iVar1 = tag->offset;
      iVar3 = UnicodeString::length(string);
      tag_local._7_1_ = iVar1 < iVar3;
    }
    else {
      tag_local._7_1_ = true;
    }
  }
  return tag_local._7_1_;
}

Assistant:

bool AffixUtils::hasNext(const AffixTag &tag, const UnicodeString &string) {
    // First check for the {-1} and default initializer syntax.
    if (tag.offset < 0) {
        return false;
    } else if (tag.offset == 0) {
        return string.length() > 0;
    }
    // The rest of the fields are safe to use now.
    // Special case: the last character in string is an end quote.
    if (tag.state == STATE_INSIDE_QUOTE && tag.offset == string.length() - 1 &&
        string.charAt(tag.offset) == u'\'') {
        return false;
    } else if (tag.state != STATE_BASE) {
        return true;
    } else {
        return tag.offset < string.length();
    }
}